

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_common.cpp
# Opt level: O3

int __thiscall myutils::SharedSemaphore::timed_wait(SharedSemaphore *this,int timeout_ms)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  timeval now;
  timespec local_38;
  timeval local_28;
  
  gettimeofday(&local_28,(__timezone_ptr_t)0x0);
  local_38.tv_nsec = (long)((timeout_ms % 1000) * 1000000) + local_28.tv_usec * 1000;
  local_38.tv_sec = local_28.tv_sec + timeout_ms / 1000 + local_38.tv_nsec / 1000000000;
  local_38.tv_nsec = local_38.tv_nsec % 1000000000;
  iVar1 = sem_timedwait((sem_t *)this->m_sem,&local_38);
  iVar2 = 1;
  if (iVar1 == -1) {
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    if ((iVar1 == 4) || (iVar1 == 0xb)) {
      iVar2 = 0;
    }
    else {
      iVar2 = 0;
      if (iVar1 != 0x6e) {
        iVar2 = -1;
      }
    }
  }
  return iVar2;
}

Assistant:

int SharedSemaphore::timed_wait(int timeout_ms)
{
#ifdef _WIN32
    switch(WaitForSingleObject(m_hSemaphore, timeout_ms)){
    case WAIT_OBJECT_0:
        return 1;
    case WAIT_TIMEOUT:
        return 0;
    default:
        return -1;
    }
    
#elif defined(__linux__)

    struct timeval now;
    struct timespec outtime;

    gettimeofday(&now, NULL);
    memset(&outtime, 0, sizeof(outtime));
    outtime.tv_sec  = now.tv_sec + timeout_ms/1000;
    outtime.tv_nsec = now.tv_usec * 1000 + (timeout_ms%1000) * 1000000;
    outtime.tv_sec  += outtime.tv_nsec / 1000000000;
    outtime.tv_nsec %= 1000000000;
    int r = sem_timedwait(m_sem, &outtime);

    //cout << "wait " << r << "," << errno  << "," << timeout_ms << endl;
    if (r == -1) {
        switch(errno) {
        case ETIMEDOUT:    return 0;
        case EAGAIN:       return 0;
        case EINTR:       return 0;
        default:           return -1;
        }
    } else {
        return 1;
    }

#else
    struct timeval now;
    struct timespec outtime;

    pthread_mutex_lock(&m_data->mtx);

    if (m_data->count <= 0 ) {
        gettimeofday(&now, NULL);
        memset(&outtime, 0, sizeof(outtime));
        outtime.tv_sec  = now.tv_sec + timeout_ms/1000;
        outtime.tv_nsec = now.tv_usec * 1000 + (timeout_ms%1000) * 1000000;
        outtime.tv_sec  += outtime.tv_nsec / 1000000000;
        outtime.tv_nsec %= 1000000000;
        int r = pthread_cond_timedwait(&m_data->cond, &m_data->mtx, &outtime);
        int ret = 0;
        //cout << "wait " << r << "," << m_data->count << "," << timeout_ms << endl;
        if (m_data->count > 0) {
            m_data->count--;
            ret = 1;
        }
        pthread_mutex_unlock (&m_data->mtx);

        switch(r) {
        case 0:            return ret;
        case ETIMEDOUT:    return 0;
        default:           return -1;
        }

    } else {
        //cout << "wait has value " << m_data->count << endl;
        m_data->count--;
        pthread_mutex_unlock (&m_data->mtx);
        return 1;
    }
#endif
}